

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void print_2D_double(double *a,int ld,int *lo,int *hi)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  
  lVar1 = (long)*lo;
  pdVar2 = a + lVar1;
  for (; lVar1 <= *hi; lVar1 = lVar1 + 1) {
    lVar4 = (long)lo[1];
    pdVar3 = (double *)((long)ld * 8 * lVar4 + (long)pdVar2);
    for (; lVar4 <= hi[1]; lVar4 = lVar4 + 1) {
      printf("%13f ",*pdVar3);
      pdVar3 = pdVar3 + ld;
    }
    putchar(10);
    pdVar2 = pdVar2 + 1;
  }
  return;
}

Assistant:

void print_2D_double(double *a, int ld, int *lo, int *hi)
{
int i,j;
     for(i=lo[0];i<=hi[0];i++){
       for(j=lo[1];j<=hi[1];j++) printf("%13f ",a[ld*j+i]);
       printf("\n");
     }
}